

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O2

void __thiscall PolyFit<double>::dataToEigen(PolyFit<double> *this)

{
  Scalar SVar1;
  pointer pdVar2;
  Scalar *pSVar3;
  int i;
  long lVar4;
  int i_1;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(int)((ulong)((long)(this->x->super__Vector_base<double,_std::allocator<double>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->x->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(int)((ulong)((long)(this->y->super__Vector_base<double,_std::allocator<double>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->y->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),1);
  for (lVar4 = 0;
      pdVar2 = (this->x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(this->x->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
      lVar4 = lVar4 + 1) {
    SVar1 = pdVar2[lVar4];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->xM,
                        lVar4,0);
    *pSVar3 = SVar1;
  }
  for (lVar4 = 0;
      pdVar2 = (this->y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(this->y->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
      lVar4 = lVar4 + 1) {
    SVar1 = pdVar2[lVar4];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->yM,
                        lVar4,0);
    *pSVar3 = SVar1;
  }
  return;
}

Assistant:

void dataToEigen(void)
    {
      xM.resize(static_cast<int>(x.size()),1);
      yM.resize(static_cast<int>(y.size()),1);

      for (int i=0;i<static_cast<int>(x.size()); ++i)
        xM(i,0) = x[i];

      for (int i=0;i<static_cast<int>(y.size()); ++i)
        yM(i,0) = y[i];
    }